

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QPersistentModelIndexData_*>::reserve
          (QList<QPersistentModelIndexData_*> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<QPersistentModelIndexData_*> *pQVar2;
  qsizetype qVar3;
  QPersistentModelIndexData **b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QPersistentModelIndexData_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QPersistentModelIndexData_*> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QPersistentModelIndexData_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QPersistentModelIndexData_*> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QPersistentModelIndexData_*> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QPersistentModelIndexData_*> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QArrayDataPointer<QPersistentModelIndexData_*> *)
           capacity((QList<QPersistentModelIndexData_*> *)0x7ff39f);
  qVar3 = QArrayDataPointer<QPersistentModelIndexData_*>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar2 - qVar3) {
    QArrayDataPointer<QPersistentModelIndexData_*>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QPersistentModelIndexData_*>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_007ff543;
    QArrayDataPointer<QPersistentModelIndexData_*>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QPersistentModelIndexData_*>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QPersistentModelIndexData_*>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QPersistentModelIndexData_*>::setFlag
                ((QArrayDataPointer<QPersistentModelIndexData_*> *)0x7ff447,(ArrayOptions)f.i);
      goto LAB_007ff543;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QPersistentModelIndexData **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QPersistentModelIndexData_*> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QPersistentModelIndexData_*>::QArrayDataPointer
            (pQVar2,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar2 = (QArrayDataPointer<QPersistentModelIndexData_*> *)
           QArrayDataPointer<QPersistentModelIndexData_*>::operator->(&local_38);
  QArrayDataPointer<QPersistentModelIndexData_*>::operator->(in_RDI);
  b = QArrayDataPointer<QPersistentModelIndexData_*>::begin
                ((QArrayDataPointer<QPersistentModelIndexData_*> *)0x7ff4c7);
  QArrayDataPointer<QPersistentModelIndexData_*>::operator->(in_RDI);
  QArrayDataPointer<QPersistentModelIndexData_*>::end(pQVar2);
  QtPrivate::QPodArrayOps<QPersistentModelIndexData_*>::copyAppend
            (in_stack_ffffffffffffff90,b,(QPersistentModelIndexData **)pQVar2);
  pDVar4 = QArrayDataPointer<QPersistentModelIndexData_*>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QPersistentModelIndexData_*> *)
         QArrayDataPointer<QPersistentModelIndexData_*>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar2,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QPersistentModelIndexData_*>::setFlag
              ((QArrayDataPointer<QPersistentModelIndexData_*> *)0x7ff52a,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QPersistentModelIndexData_*>::swap(pQVar2,in_stack_ffffffffffffff78);
  QArrayDataPointer<QPersistentModelIndexData_*>::~QArrayDataPointer(pQVar2);
LAB_007ff543:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}